

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O0

void __thiscall
CTcSymBifBase::CTcSymBifBase
          (CTcSymBifBase *this,char *str,size_t len,int copy,ushort func_set_id,ushort func_idx,
          int has_retval,int min_argc,int max_argc,int varargs)

{
  undefined4 in_ECX;
  char *in_RDX;
  CTcSymbol *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined2 in_R9W;
  byte in_stack_00000008;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000018;
  byte in_stack_00000020;
  tc_symtype_t in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  
  CTcSymbol::CTcSymbol
            (in_RSI,in_RDX,CONCAT44(in_ECX,in_R8D),in_stack_ffffffffffffffbc,
             in_stack_ffffffffffffffb8);
  *in_RDI = &PTR__CTcSymBifBase_0042a870;
  *(short *)(in_RDI + 5) = (short)in_R8D;
  *(undefined2 *)((long)in_RDI + 0x2a) = in_R9W;
  *(byte *)((long)in_RDI + 0x34) =
       *(byte *)((long)in_RDI + 0x34) & 0xfd | (in_stack_00000008 & 1) << 1;
  *(undefined4 *)((long)in_RDI + 0x2c) = in_stack_00000010;
  *(undefined4 *)(in_RDI + 6) = in_stack_00000018;
  *(byte *)((long)in_RDI + 0x34) = *(byte *)((long)in_RDI + 0x34) & 0xfe | in_stack_00000020 & 1;
  return;
}

Assistant:

CTcSymBifBase(const char *str, size_t len, int copy,
                  ushort func_set_id, ushort func_idx, int has_retval,
                  int min_argc, int max_argc, int varargs)
        : CTcSymbol(str, len, copy, TC_SYM_BIF)
    {
        func_set_id_ = func_set_id;
        func_idx_ = func_idx;
        has_retval_ = has_retval;
        min_argc_ = min_argc;
        max_argc_ = max_argc;
        varargs_ = varargs;
    }